

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test::TestBody
          (GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  string_view data;
  AssertionResult gtest_ar_1;
  TestPackedEnumSmallRange empty_proto;
  TestPackedEnumSmallRange new_proto;
  TestPackedEnumSmallRange proto;
  AssertHelper local_b0;
  Message local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  AssertHelper local_98;
  undefined1 local_90 [8];
  InternalMetadata local_88;
  anon_union_24_1_493b367e_for_TestPackedEnumSmallRange_11 local_80;
  TestPackedEnumSmallRange local_68;
  TestPackedEnumSmallRange local_40;
  
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange(&local_40,(Arena *)0x0);
  iVar2 = 0x3ff;
  do {
    bVar1 = ValidateEnum(1,(uint32_t *)
                           &proto2_unittest::TestPackedEnumSmallRange_NestedEnum_internal_data_);
    if (!bVar1) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestPackedEnumSmallRange_NestedEnum_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                    ,0x1329a,
                    "void proto2_unittest::TestPackedEnumSmallRange::add_vals(::proto2_unittest::TestPackedEnumSmallRange_NestedEnum)"
                   );
    }
    RepeatedField<int>::Add(&local_40.field_0._impl_.vals_,1);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange(&local_68,(Arena *)0x0);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_90,(MessageLite *)&local_40);
  data._M_str._1_7_ = local_90._1_7_;
  data._M_str._0_1_ = local_90[0];
  data._M_len = local_88.ptr_;
  MessageLite::ParseFromString((MessageLite *)&local_68,data);
  if ((anon_union_24_1_493b367e_for_TestPackedEnumSmallRange_11 *)
      CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
    operator_delete((anon_union_24_1_493b367e_for_TestPackedEnumSmallRange_11 *)
                    CONCAT71(local_90._1_7_,local_90[0]),CONCAT71(local_80._1_7_,local_80._0_1_) + 1
                   );
  }
  local_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  if ((local_68.field_0._0_1_ & 4) != 0) {
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = local_68.field_0._12_4_;
  }
  local_b0.data_._0_4_ = 2;
  if ((local_40.field_0._0_1_ & 4) != 0) {
    local_b0.data_._0_4_ = local_40.field_0._12_4_;
  }
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_90,"new_proto.vals().Capacity()","proto.vals().Capacity()",
             (int *)&local_a8,(int *)&local_b0);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message(&local_a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = *(char **)local_88.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x388,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((long *)CONCAT44(local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_a8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_a8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88.ptr_)
    ;
  }
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_90,(Arena *)0x0);
  RepeatedField<int>::Reserve(&local_80._impl_.vals_,0x3ff);
  local_b0.data_._0_4_ = 2;
  if ((local_68.field_0._0_1_ & 4) != 0) {
    local_b0.data_._0_4_ = local_68.field_0._12_4_;
  }
  local_98.data_._0_4_ = 2;
  if ((local_80._0_1_ & 4) != 0) {
    local_98.data_._0_4_ = local_80._12_4_;
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_a8,"new_proto.vals().Capacity()","empty_proto.vals().Capacity()",
             (int *)&local_b0,(int *)&local_98);
  if (local_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x38e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_90);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange(&local_68);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange(&local_40);
  return;
}

Assistant:

TEST(GeneratedMessageTctableLiteTest, PackedEnumSmallRange) {
  // RepeatedField::Reserve(n) may set the capacity to something greater than n,
  // and this "upgrade" algorithm can even be different depending on compiler
  // optimizations!  This value is chosen such that -- with the current
  // implementation of Reserve() -- Reserve(kNumVals) always results in a
  // different final capacity than you'd get by adding elements one at a time.
  constexpr int kNumVals = 1023;
  proto2_unittest::TestPackedEnumSmallRange proto;
  for (int i = 0; i < kNumVals; i++) {
    proto.add_vals(proto2_unittest::TestPackedEnumSmallRange::FOO);
  }

  proto2_unittest::TestPackedEnumSmallRange new_proto;
  new_proto.ParseFromString(proto.SerializeAsString());

  // We should have reserved exactly the right size for new_proto's `vals`,
  // rather than growing it on demand like we did in `proto`.
  EXPECT_LT(new_proto.vals().Capacity(), proto.vals().Capacity());

  // Check that new_proto's capacity is equal to exactly what we'd get from
  // calling Reserve(n).
  proto2_unittest::TestPackedEnumSmallRange empty_proto;
  empty_proto.mutable_vals()->Reserve(kNumVals);
  EXPECT_EQ(new_proto.vals().Capacity(), empty_proto.vals().Capacity());
}